

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_curse_name(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  void *pvVar3;
  long lVar4;
  
  pcVar1 = parser_getstr(p,"name");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x38);
  pvVar3 = mem_zalloc(0x148);
  v[3] = pvVar3;
  for (lVar4 = 0; lVar4 != 0x1c; lVar4 = lVar4 + 1) {
    *(undefined2 *)((long)pvVar3 + lVar4 * 4 + 0x74) = 100;
  }
  *v = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  v[1] = pcVar1;
  pvVar2 = mem_zalloc(0x24);
  v[2] = pvVar2;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_curse_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct curse *h = parser_priv(p);
	int i;

	struct curse *curse = mem_zalloc(sizeof *curse);
	curse->obj = mem_zalloc(sizeof(struct object));
	for (i = 0; i < ELEM_MAX; i++) {
		curse->obj->el_info[i].res_level = RES_LEVEL_BASE;
	}
	curse->next = h;
	parser_setpriv(p, curse);
	curse->name = string_make(name);
	curse->poss = mem_zalloc(TV_MAX * sizeof(bool));

	return PARSE_ERROR_NONE;
}